

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.c
# Opt level: O3

int ndn_forwarder_add_route_by_str(ndn_face_intf_t *face,char *prefix,size_t length)

{
  int iVar1;
  undefined1 local_1f4 [8];
  ndn_name_t name_prefix;
  ndn_encoder_t encoder;
  
  ndn_name_from_string((ndn_name_t *)local_1f4,prefix,(uint32_t)length);
  memset(encoding_buf,0,0x800);
  name_prefix._436_8_ = encoding_buf;
  ndn_name_tlv_encode((ndn_encoder_t *)&name_prefix.components[9].size,(ndn_name_t *)local_1f4);
  iVar1 = ndn_forwarder_add_route(face,(uint8_t *)name_prefix._436_8_,0);
  return iVar1;
}

Assistant:

int
ndn_forwarder_add_route_by_str(ndn_face_intf_t* face, const char* prefix, size_t length)
{
  ndn_name_t name_prefix;
  ndn_name_from_string(&name_prefix, prefix, length);
  ndn_encoder_t encoder;
  encoder_init(&encoder, encoding_buf, sizeof(encoding_buf));
  ndn_name_tlv_encode(&encoder, &name_prefix);
  return ndn_forwarder_add_route(face, encoder.output_value, encoder.offset);
}